

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckDirectApi<cfd::js::api::json::FundRawTransactionRequest,cfd::js::api::json::FundRawTransactionResponse>
          (json *this,string *request_message,
          function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
          *bitcoin_function,
          function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
          *elements_function)

{
  bool bVar1;
  ErrorResponse res_2;
  CfdException *cfd_except_1;
  undefined1 local_428 [8];
  FundRawTransactionResponse response;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_1b8 [8];
  FundRawTransactionRequest req;
  function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
  *elements_function_local;
  function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req.fee_info_._128_8_ = elements_function;
  FundRawTransactionRequest::FundRawTransactionRequest((FundRawTransactionRequest *)local_1b8);
  core::JsonClassBase<cfd::js::api::json::FundRawTransactionRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::FundRawTransactionRequest> *)local_1b8,
             request_message);
  response.fee_amount_._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  FundRawTransactionResponse::FundRawTransactionResponse((FundRawTransactionResponse *)local_428);
  bVar1 = FundRawTransactionRequest::GetIsElements((FundRawTransactionRequest *)local_1b8);
  if (bVar1) {
    std::
    function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
    ::operator()(elements_function,(FundRawTransactionRequest *)local_1b8,
                 (FundRawTransactionResponse *)local_428);
  }
  else {
    std::
    function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
    ::operator()(bitcoin_function,(FundRawTransactionRequest *)local_1b8,
                 (FundRawTransactionResponse *)local_428);
  }
  core::JsonClassBase<cfd::js::api::json::FundRawTransactionResponse>::Serialize_abi_cxx11_
            ((JsonClassBase<cfd::js::api::json::FundRawTransactionResponse> *)&cfd_except_1);
  std::__cxx11::string::operator=((string *)this,(string *)&cfd_except_1);
  std::__cxx11::string::~string((string *)&cfd_except_1);
  FundRawTransactionResponse::~FundRawTransactionResponse((FundRawTransactionResponse *)local_428);
  response.fee_amount_._7_1_ = 1;
  FundRawTransactionRequest::~FundRawTransactionRequest((FundRawTransactionRequest *)local_1b8);
  return this;
}

Assistant:

std::string ExecuteElementsCheckDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        bitcoin_function,  // NOLINT
    std::function<void(RequestType *, ResponseType *)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }

  std::string json_message;
  try {
    ResponseType response;

    if (req.GetIsElements()) {
#ifndef CFD_DISABLE_ELEMENTS
      elements_function(&req, &response);
#else
      CfdException ex(
          CfdError::kCfdIllegalArgumentError, "functionType not supported.");
      ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
      return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
    } else {
#ifndef CFD_DISABLE_BITCOIN
      bitcoin_function(&req, &response);
#else
      CfdException ex(
          CfdError::kCfdIllegalArgumentError, "functionType not supported.");
      ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
      return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
    }

    json_message = response.Serialize();
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    json_message = res.Serialize();
  }

  // utf-8
  return json_message;
}